

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O2

void __thiscall FOOLElimination::apply(FOOLElimination *this,UnitList **units)

{
  Literal **ppLVar1;
  Clause *this_00;
  List<Kernel::Unit_*> **ppLVar2;
  Clause *pCVar3;
  List<Kernel::Unit_*> *pLVar4;
  UserErrorException *this_01;
  ulong uVar5;
  UnitList *pUVar6;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pUVar6 = (UnitList *)0x0;
  while( true ) {
    ppLVar2 = &pUVar6->_tail;
    if (pUVar6 == (UnitList *)0x0) {
      ppLVar2 = units;
    }
    pUVar6 = *ppLVar2;
    if (pUVar6 == (UnitList *)0x0) break;
    this_00 = (Clause *)pUVar6->_head;
    if (((this_00->super_Unit).field_0x4 & 1) == 0) {
      uVar5 = 0;
      while (((uint)*(undefined8 *)&this_00->field_0x38 & 0xfffff) != uVar5) {
        ppLVar1 = this_00->_literals + uVar5;
        uVar5 = uVar5 + 1;
        if ((((*ppLVar1)->super_Term)._args[0]._content & 8) == 0) {
          this_01 = (UserErrorException *)__cxa_allocate_exception(0x50);
          Kernel::Clause::literalsOnlyToString_abi_cxx11_(&sStack_68,this_00);
          std::operator+(&local_48,
                         "Input clauses (cnf) cannot use $ite, $let or $o terms. Error in ",
                         &sStack_68);
          Lib::UserErrorException::Exception(this_01,&local_48);
          __cxa_throw(this_01,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
      }
    }
    else {
      pCVar3 = (Clause *)apply(this,(FormulaUnit *)this_00);
      if (pCVar3 != this_00) {
        pUVar6->_head = (Unit *)pCVar3;
      }
    }
  }
  pLVar4 = Lib::List<Kernel::Unit_*>::concat(this->_defs,*units);
  *units = pLVar4;
  this->_defs = (UnitList *)0x0;
  return;
}

Assistant:

void FOOLElimination::apply(UnitList*& units) {
  UnitList::DelIterator us(units);
  while(us.hasNext()) {
    Unit* unit = us.next();
    if(unit->isClause()) {
      Clause* clause = static_cast<Clause*>(unit);
      for (unsigned i = 0; i < clause->length(); i++) {
        // we do not allow special terms in clauses so we check that all clause literals
        // are shared (special terms can not be shared)
        if(!(*clause)[i]->shared()){
          USER_ERROR("Input clauses (cnf) cannot use $ite, $let or $o terms. Error in "+clause->literalsOnlyToString());
        }
      }
      continue;
    }
    Unit* processedUnit = apply(static_cast<FormulaUnit*>(unit));
    if (processedUnit != unit) {
      us.replace(processedUnit);
    }
  }

  // Note that the "$true != $false" axiom is treated as a theory axiom and
  // added in TheoryAxiom.cpp

  units = UnitList::concat(_defs, units);
  _defs = 0;
}